

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O0

void __thiscall TreeWalker::acceptActionGroup(TreeWalker *this,DomActionGroup *actionGroup)

{
  qsizetype qVar1;
  const_reference ppDVar2;
  QList<DomActionGroup_*> *this_00;
  const_reference ppDVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  DomActionGroup *in_stack_ffffffffffffff58;
  QList<DomAction_*> *in_stack_ffffffffffffff60;
  int local_80;
  int local_7c;
  QList<DomActionGroup_*> local_50 [2];
  QList<DomAction_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = 0;
  while( true ) {
    DomActionGroup::elementAction(in_stack_ffffffffffffff58);
    qVar1 = QList<DomAction_*>::size(&local_20);
    QList<DomAction_*>::~QList((QList<DomAction_*> *)0x198ca3);
    if (qVar1 <= local_7c) break;
    DomActionGroup::elementAction(in_stack_ffffffffffffff58);
    ppDVar2 = QList<DomAction_*>::at(in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58)
    ;
    (**(code **)(*in_RDI + 0xd0))(in_RDI,*ppDVar2);
    QList<DomAction_*>::~QList((QList<DomAction_*> *)0x198ceb);
    local_7c = local_7c + 1;
  }
  local_80 = 0;
  while( true ) {
    this_00 = (QList<DomActionGroup_*> *)(long)local_80;
    DomActionGroup::elementActionGroup(in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 = (DomActionGroup *)QList<DomActionGroup_*>::size(local_50);
    QList<DomActionGroup_*>::~QList((QList<DomActionGroup_*> *)0x198d34);
    if ((long)in_stack_ffffffffffffff58 <= (long)this_00) break;
    DomActionGroup::elementActionGroup(in_stack_ffffffffffffff58);
    ppDVar3 = QList<DomActionGroup_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff58);
    (**(code **)(*in_RDI + 0xd8))(in_RDI,*ppDVar3);
    QList<DomActionGroup_*>::~QList((QList<DomActionGroup_*> *)0x198d7b);
    local_80 = local_80 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptActionGroup(DomActionGroup *actionGroup)
{
    for (int i=0; i<actionGroup->elementAction().size(); ++i)
        acceptAction(actionGroup->elementAction().at(i));

    for (int i=0; i<actionGroup->elementActionGroup().size(); ++i)
        acceptActionGroup(actionGroup->elementActionGroup().at(i));
}